

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O0

void __thiscall draco::RAnsSymbolDecoder<4>::~RAnsSymbolDecoder(RAnsSymbolDecoder<4> *this)

{
  RAnsDecoder<12> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  
  RAnsDecoder<12>::~RAnsDecoder(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

RAnsSymbolDecoder() : num_symbols_(0) {}